

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statement.hpp
# Opt level: O0

void __thiscall
cs::statement_for::statement_for
          (statement_for *this,
          deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
          *parallel_list,deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *block,
          context_t *c,token_base *ptr)

{
  deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *in_RCX;
  token_base *in_RDX;
  statement_base *in_RDI;
  context_t *c_00;
  context_t local_38 [3];
  
  c_00 = local_38;
  std::shared_ptr<cs::context_type>::shared_ptr
            ((shared_ptr<cs::context_type> *)in_RDX,(shared_ptr<cs::context_type> *)in_RCX);
  statement_base::statement_base(in_RDI,c_00,in_RDX);
  std::shared_ptr<cs::context_type>::~shared_ptr((shared_ptr<cs::context_type> *)0x257ea9);
  in_RDI->_vptr_statement_base = (_func_int **)&PTR__statement_for_003df600;
  std::deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>::
  deque((deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_> *
        )in_RDX,(deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
                 *)in_RCX);
  std::deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::deque
            ((deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)in_RDX,in_RCX);
  return;
}

Assistant:

statement_for(std::deque<tree_type<token_base *>> parallel_list, std::deque<statement_base *> block,
		              context_t c, token_base *ptr) : statement_base(std::move(c), ptr),
			mParallel(std::move(parallel_list)), mBlock(std::move(block)) {}